

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this)

{
  bool bVar1;
  future_status fVar2;
  char *message;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  duration<long,_std::ratio<1L,_1000L>_> local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_80 [8];
  future<void> asyncFuture;
  CountdownLatch latch;
  CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this_local;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch
            ((CountdownLatch *)
             &asyncFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0);
  std::
  async<bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::TestBody()::__0>
            ((launch)local_80,(type *)0x1);
  local_bc = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_b8,&local_bc);
  fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1000l>>
                    ((__basic_future<void> *)local_80,&local_b8);
  local_a9 = fVar2 != timeout;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_a8,
               (AssertionResult *)
               "asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::future<void>::~future((future<void> *)local_80);
  CountdownLatch::~CountdownLatch
            ((CountdownLatch *)
             &asyncFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroIndefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    auto asyncFuture = std::async(
            std::launch::async, [&latch]() {
                latch.Await();
            });
    EXPECT_TRUE(asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout);
}